

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reduce.cpp
# Opt level: O2

void reduce_min<tf::RandomPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  code *pcVar1;
  double dVar2;
  pointer piVar3;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  int iVar4;
  int *i;
  pointer piVar5;
  long lVar6;
  Executor *this;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  int local_33c;
  int pmin;
  int smin;
  Expression_lhs<const_int_&> local_330;
  ResultBuilder DOCTEST_RB;
  ulong local_2a0;
  vector<int,_std::allocator<int>_> vec;
  Result local_280;
  Task stask;
  iterator end;
  iterator beg;
  shared_ptr<tf::WorkerInterface> local_248;
  Taskflow taskflow;
  Executor executor;
  
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_248);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tf::Taskflow::Taskflow(&taskflow);
  std::vector<int,_std::allocator<int>_>::vector(&vec,1000,(allocator_type *)&DOCTEST_RB);
  piVar3 = vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar5 = vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar5 != piVar3; piVar5 = piVar5 + 1) {
    iVar4 = rand();
    *piVar5 = iVar4 % 100 + -0x32;
  }
  local_2a0 = 1;
  do {
    if ((ulong)((long)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= local_2a0) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&vec.super__Vector_base<int,_std::allocator<int>_>);
      tf::Taskflow::~Taskflow(&taskflow);
      tf::Executor::~Executor(&executor);
      return;
    }
    for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 4) {
      iVar4 = *(int *)((long)&DAT_0015aca8 + lVar6);
      smin = 0x7fffffff;
      pmin = 0x7fffffff;
      beg._M_current =
           vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      end._M_current =
           vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      std::
      vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ::clear(&taskflow._graph.
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             );
      DOCTEST_RB.super_AssertData._8_8_ = &vec;
      DOCTEST_RB.super_AssertData._24_8_ = &local_2a0;
      DOCTEST_RB.super_AssertData.m_expr = (char *)&smin;
      DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&beg;
      DOCTEST_RB.super_AssertData.m_file = (char *)&end;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:62:37),_nullptr>
                ((FlowBuilder *)&stask,(anon_class_40_5_697928ac *)&taskflow);
      DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&pmin;
      DOCTEST_RB.super_AssertData.m_expr._4_4_ = 0x3c23d70a;
      DOCTEST_RB.super_AssertData.m_failed = false;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData._42_2_ = 0x3f00;
      DOCTEST_RB.super_AssertData._8_8_ = (TestCaseData *)&beg;
      DOCTEST_RB.super_AssertData.m_file = (char *)&end;
      DOCTEST_RB.super_AssertData._24_8_ = (long)iVar4;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_taskflow_algorithm_reduce_hpp:16:10),_nullptr>
                ((FlowBuilder *)&local_280,(anon_class_56_5_c33b3b7e *)&taskflow);
      tf::Node::_precede(stask._node,(Node *)local_280._0_8_);
      this = &executor;
      tf::Executor::run((Future<void> *)&DOCTEST_RB.super_AssertData,this,&taskflow);
      std::__basic_future<void>::wait((__basic_future<void> *)&DOCTEST_RB.super_AssertData,this);
      tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB.super_AssertData);
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData._71_2_ = 0x17;
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_330.m_at = 0xc;
      DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0x51;
      DOCTEST_RB.super_AssertData.m_expr._0_4_ = 0x15d89f;
      DOCTEST_RB.super_AssertData.m_expr._4_4_ = 0;
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      local_330.lhs = &smin;
      local_33c = 0x7fffffff;
      doctest::detail::Expression_lhs<int_const&>::operator!=
                (&local_280,(Expression_lhs<int_const&> *)&local_330,&local_33c);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)&DOCTEST_RB.super_AssertData,&local_280);
      doctest::String::~String((String *)((long)&local_280 + 8));
      dVar2 = doctest::detail::ResultBuilder::log
                        ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                         (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      if (extraout_AL != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
      doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData._71_2_ = 0x17;
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_330.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0x52;
      DOCTEST_RB.super_AssertData.m_expr._0_4_ = 0x15d8c7;
      DOCTEST_RB.super_AssertData.m_expr._4_4_ = 0;
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      local_330.lhs = &pmin;
      local_33c = 0x7fffffff;
      DOCTEST_RB.super_AssertData.m_at = local_330.m_at;
      doctest::detail::Expression_lhs<int_const&>::operator!=
                (&local_280,(Expression_lhs<int_const&> *)&local_330,&local_33c);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)&DOCTEST_RB.super_AssertData,&local_280);
      doctest::String::~String((String *)((long)&local_280 + 8));
      dVar2 = doctest::detail::ResultBuilder::log
                        ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                         (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      if (extraout_AL_00 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
      doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData._71_2_ = 0x17;
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_330.m_at = 0xc;
      DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0x53;
      DOCTEST_RB.super_AssertData.m_expr._0_4_ = 0x15d8ef;
      DOCTEST_RB.super_AssertData.m_expr._4_4_ = 0;
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      local_330.lhs = &smin;
      doctest::detail::Expression_lhs<const_int_&>::operator==<int,_nullptr>
                (&local_280,&local_330,&pmin);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)&DOCTEST_RB.super_AssertData,&local_280);
      doctest::String::~String((String *)((long)&local_280 + 8));
      dVar2 = doctest::detail::ResultBuilder::log
                        ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                         (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      if (extraout_AL_01 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
      doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    }
    local_2a0 = local_2a0 + 1;
  } while( true );
}

Assistant:

void reduce_min(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::vector<int> vec(1000);

  for(auto& i : vec) i = ::rand() % 100 - 50;

  for(size_t n=1; n<vec.size(); n++) {
    for(size_t c : {0, 1, 3, 7, 99}) {

      int smin = std::numeric_limits<int>::max();
      int pmin = std::numeric_limits<int>::max();
      auto beg = vec.end();
      auto end = vec.end();

      taskflow.clear();
      auto stask = taskflow.emplace([&](){
        beg = vec.begin();
        end = vec.begin() + n;
        for(auto itr = beg; itr != end; itr++) {
          smin = std::min(*itr, smin);
        }
      });

      tf::Task ptask;

      ptask = taskflow.reduce(
        std::ref(beg), std::ref(end), pmin, [](int& l, int& r){
        return std::min(l, r);
      }, P(c));

      stask.precede(ptask);

      executor.run(taskflow).wait();

      REQUIRE(smin != std::numeric_limits<int>::max());
      REQUIRE(pmin != std::numeric_limits<int>::max());
      REQUIRE(smin == pmin);
    }
  }
}